

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::C_Decrypt(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pEncryptedData,
                  CK_ULONG ulEncryptedDataLen,CK_BYTE_PTR pData,CK_ULONG_PTR pulDataLen)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  Session *this_00;
  SymmetricAlgorithm *pSVar4;
  undefined4 extraout_var;
  AsymmetricAlgorithm *pAVar5;
  PrivateKey *pPVar6;
  ulong uVar7;
  size_t sVar8;
  uchar *puVar9;
  CK_RV CStack_d0;
  ByteString data;
  ByteString encryptedData;
  ByteString local_58;
  
  if (this->isInitialised != true) {
    return 400;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  if (pEncryptedData == (CK_BYTE_PTR)0x0 || pulDataLen == (CK_ULONG_PTR)0x0) {
    Session::resetOp(this_00);
    return 7;
  }
  iVar2 = Session::getOpType(this_00);
  if (iVar2 != 3) {
    return 0x91;
  }
  pSVar4 = Session::getSymmetricCryptoOp(this_00);
  if (pSVar4 == (SymmetricAlgorithm *)0x0) {
    pAVar5 = Session::getAsymmetricCryptoOp(this_00);
    TVar3 = Session::getMechanism(this_00);
    pPVar6 = Session::getPrivateKey(this_00);
    if ((pAVar5 == (AsymmetricAlgorithm *)0x0) ||
       (bVar1 = Session::getAllowSinglePartOp(this_00), pPVar6 == (PrivateKey *)0x0 || !bVar1))
    goto LAB_00133c1e;
    bVar1 = Session::getReAuthentication(this_00);
    if (bVar1) {
      Session::resetOp(this_00);
      return 0x101;
    }
    uVar7 = (**(code **)(*(long *)pPVar6 + 0x28))(pPVar6);
    if (pData == (CK_BYTE_PTR)0x0) {
      *pulDataLen = uVar7;
      return 0;
    }
    if (*pulDataLen < uVar7) {
      *pulDataLen = uVar7;
      return 0x150;
    }
    ByteString::ByteString(&encryptedData,pEncryptedData,ulEncryptedDataLen);
    ByteString::ByteString(&data);
    iVar2 = (*pAVar5->_vptr_AsymmetricAlgorithm[0xb])
                      (pAVar5,pPVar6,&encryptedData,&data,(ulong)TVar3);
    if ((char)iVar2 != '\0') {
      sVar8 = ByteString::size(&data);
      if (uVar7 < sVar8) {
        softHSMLog(3,"AsymDecrypt",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0xd3b,"The size of the decrypted data exceeds the size of the mechanism");
        Session::resetOp(this_00);
        CStack_d0 = 0x41;
      }
      else {
        sVar8 = ByteString::size(&data);
        if (sVar8 != 0) {
          puVar9 = ByteString::byte_str(&data);
          sVar8 = ByteString::size(&data);
          memcpy(pData,puVar9,sVar8);
        }
        sVar8 = ByteString::size(&data);
        *pulDataLen = sVar8;
        Session::resetOp(this_00);
        CStack_d0 = 0;
      }
      goto LAB_00133e46;
    }
    Session::resetOp(this_00);
  }
  else {
    pSVar4 = Session::getSymmetricCryptoOp(this_00);
    if ((pSVar4 == (SymmetricAlgorithm *)0x0) ||
       (bVar1 = Session::getAllowSinglePartOp(this_00), !bVar1)) {
LAB_00133c1e:
      Session::resetOp(this_00);
      return 0x91;
    }
    iVar2 = (*pSVar4->_vptr_SymmetricAlgorithm[0x13])(pSVar4);
    if ((((char)iVar2 != '\0') &&
        (iVar2 = (*pSVar4->_vptr_SymmetricAlgorithm[0xd])(pSVar4),
        ulEncryptedDataLen % CONCAT44(extraout_var,iVar2) != 0)) ||
       (iVar2 = (*pSVar4->_vptr_SymmetricAlgorithm[0x14])(pSVar4,ulEncryptedDataLen),
       (char)iVar2 == '\0')) {
      Session::resetOp(this_00);
      return 0x41;
    }
    if (pData == (CK_BYTE_PTR)0x0) {
      *pulDataLen = ulEncryptedDataLen;
      return 0;
    }
    if (*pulDataLen < ulEncryptedDataLen) {
      *pulDataLen = ulEncryptedDataLen;
      return 0x150;
    }
    ByteString::ByteString(&encryptedData,pEncryptedData,ulEncryptedDataLen);
    ByteString::ByteString(&data);
    iVar2 = (*pSVar4->_vptr_SymmetricAlgorithm[6])(pSVar4,&encryptedData,&data);
    if ((char)iVar2 != '\0') {
      ByteString::ByteString(&local_58);
      iVar2 = (*pSVar4->_vptr_SymmetricAlgorithm[7])(pSVar4,&local_58);
      if ((char)iVar2 == '\0') {
        Session::resetOp(this_00);
        CStack_d0 = 0x40;
      }
      else {
        ByteString::operator+=(&data,&local_58);
        sVar8 = ByteString::size(&data);
        if (ulEncryptedDataLen < sVar8) {
          ByteString::resize(&data,ulEncryptedDataLen);
        }
        sVar8 = ByteString::size(&data);
        if (sVar8 != 0) {
          puVar9 = ByteString::byte_str(&data);
          sVar8 = ByteString::size(&data);
          memcpy(pData,puVar9,sVar8);
        }
        sVar8 = ByteString::size(&data);
        *pulDataLen = sVar8;
        Session::resetOp(this_00);
        CStack_d0 = 0;
      }
      ByteString::~ByteString(&local_58);
      goto LAB_00133e46;
    }
    Session::resetOp(this_00);
  }
  CStack_d0 = 0x40;
LAB_00133e46:
  ByteString::~ByteString(&data);
  ByteString::~ByteString(&encryptedData);
  return CStack_d0;
}

Assistant:

CK_RV SoftHSM::C_Decrypt(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pEncryptedData, CK_ULONG ulEncryptedDataLen, CK_BYTE_PTR pData, CK_ULONG_PTR pulDataLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	if ((pEncryptedData == NULL_PTR) || (pulDataLen == NULL_PTR))
	{
		session->resetOp();

		return CKR_ARGUMENTS_BAD;
	}

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_DECRYPT)
		return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getSymmetricCryptoOp() != NULL)
		return SymDecrypt(session, pEncryptedData, ulEncryptedDataLen,
				  pData, pulDataLen);
	else
		return AsymDecrypt(session, pEncryptedData, ulEncryptedDataLen,
				   pData, pulDataLen);
}